

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadgamma.hpp
# Opt level: O1

int upload_gamma(int n)

{
  float *data;
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  vector<TensorEntry,_std::allocator<TensorEntry>_> v;
  vector<TensorEntry,_std::allocator<TensorEntry>_> local_28;
  
  readGamma(&local_28,n);
  data = (float *)operator_new__(0x1000000);
  if ((long)local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar2 = ((long)local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pfVar1 = &(local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
               super__Vector_impl_data._M_start)->val;
    pfVar3 = data + 3;
    do {
      pfVar3[-3] = (float)(int)((TensorEntry *)(pfVar1 + -2))->a;
      pfVar3[-2] = (float)(int)*(short *)((long)pfVar1 + -6);
      pfVar3[-1] = (float)(int)*(short *)(pfVar1 + -1);
      *pfVar3 = *pfVar1;
      pfVar1 = pfVar1 + 3;
      pfVar3 = pfVar3 + 4;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*glad_glActiveTexture)(33999);
  create_2D_float_texture(0x400,0x400,4,data,0x2600,false);
  operator_delete__(data);
  if (local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_28.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
}

Assistant:

int upload_gamma(int n)
{
	auto v = readGamma(n);
	const int width = 1024;
	const int height = 1024;
	float* data = new float[width * height * 4];
	for (int i=0; i<v.size(); ++i)
	{
		data[i*4+0] = float(v[i].a);
		data[i*4+1] = float(v[i].b);
		data[i*4+2] = float(v[i].c);
		data[i*4+3] = v[i].val;
	}
	glActiveTexture(GL_TEXTURE15);
	create_2D_float_texture(1024, 1024, 4, data, GL_NEAREST);
	delete[] data;
	return v.size();
}